

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tree_schema_common.c
# Opt level: O0

lysp_restr ** lysp_node_musts_p(lysp_node *node)

{
  uint16_t uVar1;
  lysp_node *node_local;
  
  if (node == (lysp_node *)0x0) {
    node_local = (lysp_node *)0x0;
  }
  else {
    uVar1 = node->nodetype;
    if (uVar1 == 1) {
      node_local = node + 1;
    }
    else if (uVar1 == 4) {
      node_local = node + 1;
    }
    else if (uVar1 == 8) {
      node_local = node + 1;
    }
    else if (uVar1 == 0x10) {
      node_local = node + 1;
    }
    else if ((uVar1 == 0x20) || (uVar1 == 0x60)) {
      node_local = node + 1;
    }
    else if (uVar1 == 0x400) {
      node_local = node + 1;
    }
    else if ((uVar1 == 0x1000) || (uVar1 == 0x2000)) {
      node_local = node + 1;
    }
    else {
      node_local = (lysp_node *)0x0;
    }
  }
  return (lysp_restr **)node_local;
}

Assistant:

struct lysp_restr **
lysp_node_musts_p(const struct lysp_node *node)
{
    if (!node) {
        return NULL;
    }

    switch (node->nodetype) {
    case LYS_CONTAINER:
        return &((struct lysp_node_container *)node)->musts;
    case LYS_LEAF:
        return &((struct lysp_node_leaf *)node)->musts;
    case LYS_LEAFLIST:
        return &((struct lysp_node_leaflist *)node)->musts;
    case LYS_LIST:
        return &((struct lysp_node_list *)node)->musts;
    case LYS_ANYXML:
    case LYS_ANYDATA:
        return &((struct lysp_node_anydata *)node)->musts;
    case LYS_NOTIF:
        return &((struct lysp_node_notif *)node)->musts;
    case LYS_INPUT:
    case LYS_OUTPUT:
        return &((struct lysp_node_action_inout *)node)->musts;
    default:
        return NULL;
    }
}